

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O3

base_block_t *
base_block_alloc(tsdn_t *tsdn,base_t *base,ehooks_t *ehooks,uint ind,pszind_t *pind_last,
                size_t *duckdb_je_extent_sn_next,size_t size,size_t alignment)

{
  int8_t *piVar1;
  uint64_t *puVar2;
  witness_t **ppwVar3;
  extent_hooks_t *peVar4;
  uint64_t uVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  base_block_t *addr_00;
  tsd_t *ptVar9;
  uint uVar10;
  undefined4 in_register_0000000c;
  uint *puVar11;
  long lVar12;
  base_t *pbVar13;
  base_block_t *pbVar14;
  void *addr;
  int iVar15;
  ulong uVar16;
  base_block_t *addr_01;
  _Bool local_4a;
  _Bool zero;
  base_t *local_48;
  pthread_mutex_t *local_40;
  uint *local_38;
  
  puVar11 = (uint *)CONCAT44(in_register_0000000c,ind);
  uVar8 = size + 0xf & 0xfffffffffffffff0;
  uVar8 = (uVar8 + 0x8f & -uVar8) + ((long)duckdb_je_extent_sn_next + (uVar8 - 1) & -uVar8);
  if (uVar8 < 0x7000000000000001) {
    uVar16 = uVar8 * 2 - 1;
    lVar12 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    uVar16 = 0xfff;
    if (0xe < (uint)lVar12) {
      uVar16 = ~(-1L << ((char)lVar12 - 3U & 0x3f));
    }
    uVar8 = (~uVar16 & uVar8 + uVar16) + 0x1fffff;
  }
  else {
    uVar8 = 0x7000000000200fff;
  }
  uVar10 = *puVar11 + 1;
  uVar6 = *puVar11;
  if (uVar10 < 0xc6) {
    uVar6 = uVar10;
  }
  uVar16 = duckdb_je_sz_pind2sz_tab[uVar6] + 0x1fffff;
  if (duckdb_je_sz_pind2sz_tab[uVar6] + 0x1fffff < uVar8) {
    uVar16 = uVar8;
  }
  uVar16 = uVar16 & 0xffffffffffe00000;
  zero = true;
  local_4a = true;
  local_48 = base;
  if ((extent_hooks_t *)(ehooks->ptr).repr == &duckdb_je_ehooks_default_extent_hooks) {
    addr_00 = (base_block_t *)
              duckdb_je_extent_alloc_mmap((void *)0x0,uVar16,0x200000,&zero,&local_4a);
  }
  else {
    peVar4 = (extent_hooks_t *)(ehooks->ptr).repr;
    if (peVar4 == &duckdb_je_ehooks_default_extent_hooks) {
      addr_00 = (base_block_t *)
                duckdb_je_ehooks_default_alloc_impl
                          (tsdn,(void *)0x0,uVar16,0x200000,&zero,&local_4a,ehooks->ind);
    }
    else {
      ptVar9 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar9 = (tsd_t *)__tls_get_addr(&PTR_0249db70), (ptVar9->state).repr != '\0')) {
        ptVar9 = duckdb_je_tsd_fetch_slow(ptVar9,false);
      }
      ptVar9->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           ptVar9->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level + '\x01';
      if ((ptVar9->state).repr == '\0') {
        duckdb_je_tsd_slow_update(ptVar9);
      }
      addr_00 = (base_block_t *)
                (*peVar4->alloc)(peVar4,(void *)0x0,uVar16,0x200000,&zero,&local_4a,ehooks->ind);
      ptVar9 = &tsdn->tsd;
      if ((tsdn == (tsdn_t *)0x0) &&
         (ptVar9 = (tsd_t *)__tls_get_addr(&PTR_0249db70), (ptVar9->state).repr != '\0')) {
        ptVar9 = duckdb_je_tsd_fetch_slow(ptVar9,false);
      }
      piVar1 = &ptVar9->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == '\0') {
        duckdb_je_tsd_slow_update(ptVar9);
      }
    }
  }
  pbVar13 = local_48;
  if (addr_00 == (base_block_t *)0x0) {
    return (base_block_t *)0x0;
  }
  if ((duckdb_je_opt_metadata_thp == metadata_thp_disabled) ||
     (duckdb_je_init_system_thp_mode != thp_mode_default)) goto LAB_00cdeb8a;
  if (duckdb_je_opt_metadata_thp == metadata_thp_always) {
    duckdb_je_pages_huge(addr_00,uVar16);
    goto LAB_00cdeb8a;
  }
  if (local_48 == (base_t *)0x0 || duckdb_je_opt_metadata_thp != metadata_thp_auto)
  goto LAB_00cdeb8a;
  local_40 = (pthread_mutex_t *)((long)&(local_48->mtx).field_0 + 0x48);
  local_38 = puVar11;
  iVar15 = pthread_mutex_trylock(local_40);
  if (iVar15 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&pbVar13->mtx);
    (local_48->mtx).field_0.field_0.locked.repr = true;
    pbVar13 = local_48;
  }
  puVar11 = local_38;
  puVar2 = &(pbVar13->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar2 = *puVar2 + 1;
  if ((pbVar13->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (pbVar13->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar3 = &(pbVar13->mtx).field_0.witness.link.qre_prev;
    *ppwVar3 = (witness_t *)((long)&(*ppwVar3)->name + 1);
  }
  bVar7 = pbVar13->auto_thp_switched;
  if ((_Bool)bVar7 == false) {
    addr_01 = pbVar13->blocks;
    if ((pbVar13->ehooks).ind == 0) {
      lVar12 = 4;
      pbVar14 = addr_01;
      do {
        pbVar14 = pbVar14->next;
        lVar12 = lVar12 + -1;
      } while (pbVar14 != (base_block_t *)0x0);
    }
    else {
      lVar12 = 1;
      pbVar14 = addr_01;
      do {
        pbVar14 = pbVar14->next;
        lVar12 = lVar12 + -1;
      } while (pbVar14 != (base_block_t *)0x0);
    }
    pbVar13 = local_48;
    if (lVar12 != 0) goto LAB_00cdeb68;
    local_48->auto_thp_switched = true;
    if (addr_01 != (base_block_t *)0x0) {
      do {
        duckdb_je_pages_huge(addr_01,addr_01->size);
        local_48->n_thp =
             local_48->n_thp +
             ((addr_01->size - (addr_01->edata).field_2.e_size_esn) + 0x1fffff >> 0x15);
        addr_01 = addr_01->next;
      } while (addr_01 != (base_block_t *)0x0);
      bVar7 = local_48->auto_thp_switched;
      pbVar13 = local_48;
      goto LAB_00cdeb68;
    }
LAB_00cdeb6c:
    duckdb_je_pages_huge(addr_00,uVar16);
    pbVar13 = local_48;
  }
  else {
LAB_00cdeb68:
    if ((bVar7 & 1) != 0) goto LAB_00cdeb6c;
  }
  (pbVar13->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock(local_40);
LAB_00cdeb8a:
  if (uVar16 < 0x7000000000000001) {
    uVar8 = uVar16 - 1;
    lVar12 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    uVar10 = (uint)lVar12 ^ 0x3f;
    iVar15 = 0x32 - uVar10;
    if (0x32 < uVar10) {
      iVar15 = 0;
    }
    uVar10 = ((uint)(uVar8 >> ((char)iVar15 + 0xbU & 0x3f)) & 3) + iVar15 * 4;
  }
  else {
    uVar10 = 199;
  }
  *puVar11 = uVar10;
  addr_00->size = uVar16;
  addr_00->next = (base_block_t *)0x0;
  uVar5 = *(uint64_t *)pind_last;
  *(uint64_t *)pind_last = uVar5 + 1;
  (addr_00->edata).e_addr = addr_00 + 1;
  (addr_00->edata).field_2.e_size_esn = uVar16 - 0x90;
  (addr_00->edata).e_sn = uVar5;
  (addr_00->edata).e_bits = (addr_00->edata).e_bits & 0xfffffffff0000000 | 0xe80afff;
  return addr_00;
}

Assistant:

static base_block_t *
base_block_alloc(tsdn_t *tsdn, base_t *base, ehooks_t *ehooks, unsigned ind,
    pszind_t *pind_last, size_t *extent_sn_next, size_t size,
    size_t alignment) {
	alignment = ALIGNMENT_CEILING(alignment, QUANTUM);
	size_t usize = ALIGNMENT_CEILING(size, alignment);
	size_t header_size = sizeof(base_block_t);
	size_t gap_size = ALIGNMENT_CEILING(header_size, alignment) -
	    header_size;
	/*
	 * Create increasingly larger blocks in order to limit the total number
	 * of disjoint virtual memory ranges.  Choose the next size in the page
	 * size class series (skipping size classes that are not a multiple of
	 * HUGEPAGE), or a size large enough to satisfy the requested size and
	 * alignment, whichever is larger.
	 */
	size_t min_block_size = HUGEPAGE_CEILING(sz_psz2u(header_size + gap_size
	    + usize));
	pszind_t pind_next = (*pind_last + 1 < sz_psz2ind(SC_LARGE_MAXCLASS)) ?
	    *pind_last + 1 : *pind_last;
	size_t next_block_size = HUGEPAGE_CEILING(sz_pind2sz(pind_next));
	size_t block_size = (min_block_size > next_block_size) ? min_block_size
	    : next_block_size;
	base_block_t *block = (base_block_t *)base_map(tsdn, ehooks, ind,
	    block_size);
	if (block == NULL) {
		return NULL;
	}

	if (metadata_thp_madvise()) {
		void *addr = (void *)block;
		assert(((uintptr_t)addr & HUGEPAGE_MASK) == 0 &&
		    (block_size & HUGEPAGE_MASK) == 0);
		if (opt_metadata_thp == metadata_thp_always) {
			pages_huge(addr, block_size);
		} else if (opt_metadata_thp == metadata_thp_auto &&
		    base != NULL) {
			/* base != NULL indicates this is not a new base. */
			malloc_mutex_lock(tsdn, &base->mtx);
			base_auto_thp_switch(tsdn, base);
			if (base->auto_thp_switched) {
				pages_huge(addr, block_size);
			}
			malloc_mutex_unlock(tsdn, &base->mtx);
		}
	}

	*pind_last = sz_psz2ind(block_size);
	block->size = block_size;
	block->next = NULL;
	assert(block_size >= header_size);
	base_edata_init(extent_sn_next, &block->edata,
	    (void *)((byte_t *)block + header_size), block_size - header_size);
	return block;
}